

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O3

void compact_int64_suite::test_array16_int64_two(void)

{
  value vVar1;
  value_type expected [16];
  value_type input [19];
  decoder decoder;
  value local_8c;
  value local_88 [4];
  undefined1 local_78 [12];
  undefined4 local_6c;
  uchar local_68 [24];
  decoder local_50;
  
  local_50.input._M_str = local_68;
  local_68[0] = 0xbe;
  local_68[1] = '\x10';
  local_68[2] = '\0';
  local_68[3] = '\x11';
  local_68[4] = '\"';
  local_68[5] = '3';
  local_68[6] = 'D';
  local_68[7] = 'U';
  local_68[8] = 'f';
  local_68[9] = 'w';
  local_68[10] = 0x88;
  local_68[0xb] = 0x99;
  local_68[0xc] = 0xaa;
  local_68[0xd] = 0xbb;
  local_68[0xe] = 0xcc;
  local_68[0xf] = 0xdd;
  local_68[0x10] = 0xee;
  local_68[0x11] = 0xff;
  local_68[0x12] = '\0';
  local_50.input._M_len = 0x13;
  local_50.current.view._M_len = 0;
  local_50.current.view._M_str = (uchar *)0x0;
  local_50.current.code = end;
  trial::protocol::bintoken::detail::decoder::next(&local_50);
  local_88[0] = local_50.current.code;
  local_8c = 0xbe;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::array16_int64",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xb06,"void compact_int64_suite::test_array16_int64_two()",local_88,&local_8c);
  local_88[0] = trial::protocol::bintoken::token::symbol::convert(local_50.current.code);
  local_8c = array;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::symbol::value,trial::protocol::bintoken::token::symbol::value>
            ("decoder.symbol()","token::symbol::array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xb07,"void compact_int64_suite::test_array16_int64_two()",local_88,&local_8c);
  vVar1 = trial::protocol::bintoken::token::symbol::convert(local_50.current.code);
  local_88[0] = end;
  if (vVar1 - null < 0xc) {
    local_88[0] = *(value *)(&DAT_00124a00 + (ulong)(vVar1 - null) * 4);
  }
  local_8c = null;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::category::value,trial::protocol::bintoken::token::category::value>
            ("decoder.category()","token::category::data",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xb08,"void compact_int64_suite::test_array16_int64_two()",local_88,&local_8c);
  local_88[0] = 0x44332211;
  local_88[1] = 0x88776655;
  local_88[2] = 0xccbbaa99;
  local_88[3] = 0xffeedd;
  boost::detail::
  test_all_with_impl<std::ostream,unsigned_char_const*,unsigned_char_const*,std::equal_to<unsigned_char>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xb0f,"void compact_int64_suite::test_array16_int64_two()",
             local_50.current.view._M_str,
             local_50.current.view._M_str + local_50.current.view._M_len,local_88,local_78);
  trial::protocol::bintoken::detail::decoder::next(&local_50);
  local_8c = local_50.current.code;
  local_6c = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xb11,"void compact_int64_suite::test_array16_int64_two()",&local_8c,&local_6c);
  return;
}

Assistant:

void test_array16_int64_two()
{
    const value_type input[] = { token::code::array16_int64, 0x10, 0x00, 0x11, 0x22, 0x33, 0x44, 0x55, 0x66, 0x77, 0x88, 0x99, 0xAA, 0xBB, 0xCC, 0xDD, 0xEE, 0xFF, 0x00 };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::array16_int64);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.symbol(), token::symbol::array);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.category(), token::category::data);
    const value_type expected[] = {
        0x11, 0x22, 0x33, 0x44, 0x55, 0x66, 0x77, 0x88,
        0x99, 0xAA, 0xBB, 0xCC, 0xDD, 0xEE, 0xFF, 0x00
    };
    TRIAL_PROTOCOL_TEST_ALL_WITH(decoder.literal().begin(), decoder.literal().end(),
                                 expected, expected + sizeof(expected),
                                 std::equal_to<value_type>());
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}